

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

t_template * template_new(t_symbol *templatesym,int argc,t_atom *argv)

{
  int iVar1;
  _gtemplate *p_Var2;
  t_symbol *ptVar3;
  t_template *x_00;
  t_dataslot *ptVar4;
  _gtemplate *p_Var5;
  t_symbol *newtypesym;
  t_symbol *newarraytemplate;
  t_symbol *newname;
  int newn;
  int oldn;
  int newtype;
  t_template *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *templatesym_local;
  
  x_00 = (t_template *)pd_new(template_class);
  x_00->t_n = 0;
  ptVar4 = (t_dataslot *)getbytes(0);
  x_00->t_vec = ptVar4;
  x_00->t_next = (_template *)0x0;
  template_addtolist(x_00);
  x = (t_template *)argv;
  argv_local._4_4_ = argc;
  do {
    if (argv_local._4_4_ < 1) {
      if (*templatesym->s_name == '\0') {
        x_00->t_sym = templatesym;
      }
      else {
        x_00->t_sym = templatesym;
        pd_bind((t_pd *)x_00,x_00->t_sym);
      }
      return x_00;
    }
    newtypesym = &s_;
    if (((argv_local._4_4_ < 2) || (*(int *)&x->t_pdobj != 2)) || (*(int *)&x->t_sym != 2))
    goto LAB_0017f177;
    p_Var2 = x->t_list;
    ptVar3 = *(t_symbol **)&x->t_n;
    if (p_Var2 == (_gtemplate *)&s_float) {
      newn = 0;
LAB_0017f0e7:
      iVar1 = x_00->t_n;
      ptVar4 = (t_dataslot *)resizebytes(x_00->t_vec,(long)iVar1 * 0x18,(long)(iVar1 + 1) * 0x18);
      x_00->t_vec = ptVar4;
      x_00->t_n = iVar1 + 1;
      x_00->t_vec[iVar1].ds_type = newn;
      x_00->t_vec[iVar1].ds_name = ptVar3;
      x_00->t_vec[iVar1].ds_arraytemplate = newtypesym;
    }
    else {
      if (p_Var2 == (_gtemplate *)&s_symbol) {
        newn = 1;
        goto LAB_0017f0e7;
      }
      p_Var5 = (_gtemplate *)gensym("text");
      if ((p_Var2 == p_Var5) || (p_Var2 == (_gtemplate *)&s_list)) {
        newn = 2;
        goto LAB_0017f0e7;
      }
      p_Var5 = (_gtemplate *)gensym("array");
      if (p_Var2 == p_Var5) {
        if ((2 < argv_local._4_4_) && (*(int *)&x->t_vec == 2)) {
          newtypesym = canvas_makebindsym((t_symbol *)x->t_next);
          newn = 3;
          argv_local._4_4_ = argv_local._4_4_ + -1;
          x = (t_template *)&x->t_sym;
          goto LAB_0017f0e7;
        }
        pd_error(x_00,"array lacks element template or name");
      }
      else {
        pd_error(x_00,"%s: no such type",(p_Var2->x_obj).te_g.g_pd);
      }
    }
LAB_0017f177:
    argv_local._4_4_ = argv_local._4_4_ + -2;
    x = (t_template *)&x->t_vec;
  } while( true );
}

Assistant:

t_template *template_new(t_symbol *templatesym, int argc, t_atom *argv)
{
    t_template *x = (t_template *)pd_new(template_class);
    x->t_n = 0;
    x->t_vec = (t_dataslot *)t_getbytes(0);
    x->t_next = 0;
    template_addtolist(x);
    while (argc > 0)
    {
        int newtype, oldn, newn;
        t_symbol *newname, *newarraytemplate = &s_, *newtypesym;
        if (argc < 2 || argv[0].a_type != A_SYMBOL ||
            argv[1].a_type != A_SYMBOL)
                goto bad;
        newtypesym = argv[0].a_w.w_symbol;
        newname = argv[1].a_w.w_symbol;
        if (newtypesym == &s_float)
            newtype = DT_FLOAT;
        else if (newtypesym == &s_symbol)
            newtype = DT_SYMBOL;
                /* "list" is old name.. accepted here but never saved as such */
        else if (newtypesym == gensym("text") || newtypesym == &s_list)
            newtype = DT_TEXT;
        else if (newtypesym == gensym("array"))
        {
            if (argc < 3 || argv[2].a_type != A_SYMBOL)
            {
                pd_error(x, "array lacks element template or name");
                goto bad;
            }
            newarraytemplate = canvas_makebindsym(argv[2].a_w.w_symbol);
            newtype = DT_ARRAY;
            argc--;
            argv++;
        }
        else
        {
            pd_error(x, "%s: no such type", newtypesym->s_name);
            goto bad;
        }
        newn = (oldn = x->t_n) + 1;
        x->t_vec = (t_dataslot *)t_resizebytes(x->t_vec,
            oldn * sizeof(*x->t_vec), newn * sizeof(*x->t_vec));
        x->t_n = newn;
        x->t_vec[oldn].ds_type = newtype;
        x->t_vec[oldn].ds_name = newname;
        x->t_vec[oldn].ds_arraytemplate = newarraytemplate;
    bad:
        argc -= 2; argv += 2;
    }
    if (*templatesym->s_name)
    {
        x->t_sym = templatesym;
        pd_bind(&x->t_pdobj, x->t_sym);
    }
    else x->t_sym = templatesym;
    return (x);
}